

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImStb::STB_TEXTEDIT_INSERTCHARS
               (ImGuiInputTextState *obj,int pos,ImWchar *new_text,int new_text_len)

{
  int iVar1;
  unsigned_short *puVar2;
  int iVar3;
  unsigned_short *puVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  
  iVar1 = obj->CurLenW;
  if (iVar1 < pos) {
    __assert_fail("pos <= text_len",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0xde5,
                  "bool ImStb::STB_TEXTEDIT_INSERTCHARS(ImGuiInputTextState *, int, const ImWchar *, int)"
                 );
  }
  uVar7 = obj->UserFlags;
  lVar8 = (long)new_text_len;
  iVar3 = ImTextCountUtf8BytesFromStr(new_text,new_text + lVar8);
  if ((uVar7 >> 0x12 & 1) == 0) {
    if ((obj->BufCapacityA <= obj->CurLenA + iVar3) || ((obj->TextW).Size <= new_text_len + iVar1))
    {
      return false;
    }
  }
  else {
    iVar6 = (obj->TextW).Size;
    if (iVar6 <= new_text_len + iVar1) {
      if (iVar6 <= iVar1) {
        __assert_fail("text_len < obj->TextW.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                      ,0xdf0,
                      "bool ImStb::STB_TEXTEDIT_INSERTCHARS(ImGuiInputTextState *, int, const ImWchar *, int)"
                     );
      }
      uVar7 = 0x100;
      if (0x100 < (uint)new_text_len) {
        uVar7 = new_text_len;
      }
      if ((uint)(new_text_len * 4) < uVar7) {
        uVar7 = new_text_len * 4;
      }
      uVar5 = 0x20;
      if (7 < new_text_len) {
        uVar5 = uVar7;
      }
      iVar9 = uVar5 + iVar1 + 1;
      iVar6 = (obj->TextW).Capacity;
      if (iVar6 <= (int)(uVar5 + iVar1)) {
        if (iVar6 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar6 / 2 + iVar6;
        }
        if (iVar6 <= iVar9) {
          iVar6 = iVar9;
        }
        puVar4 = (unsigned_short *)ImGui::MemAlloc((long)iVar6 * 2);
        puVar2 = (obj->TextW).Data;
        if (puVar2 != (unsigned_short *)0x0) {
          memcpy(puVar4,puVar2,(long)(obj->TextW).Size * 2);
          ImGui::MemFree((obj->TextW).Data);
        }
        (obj->TextW).Data = puVar4;
        (obj->TextW).Capacity = iVar6;
      }
      (obj->TextW).Size = iVar9;
    }
  }
  puVar2 = (obj->TextW).Data;
  if (iVar1 - pos != 0) {
    puVar4 = puVar2 + pos;
    memmove(puVar4 + lVar8,puVar4,(long)(iVar1 - pos) * 2);
  }
  memcpy(puVar2 + pos,new_text,lVar8 * 2);
  obj->Edited = true;
  obj->CurLenA = obj->CurLenA + iVar3;
  uVar7 = new_text_len + obj->CurLenW;
  obj->CurLenW = uVar7;
  if ((-1 < (int)uVar7) && ((int)uVar7 < (obj->TextW).Size)) {
    (obj->TextW).Data[uVar7] = 0;
    return true;
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.h"
                ,0x688,"T &ImVector<unsigned short>::operator[](int) [T = unsigned short]");
}

Assistant:

static bool STB_TEXTEDIT_INSERTCHARS(STB_TEXTEDIT_STRING* obj, int pos, const ImWchar* new_text, int new_text_len)
{
    const bool is_resizable = (obj->UserFlags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int text_len = obj->CurLenW;
    IM_ASSERT(pos <= text_len);

    const int new_text_len_utf8 = ImTextCountUtf8BytesFromStr(new_text, new_text + new_text_len);
    if (!is_resizable && (new_text_len_utf8 + obj->CurLenA + 1 > obj->BufCapacityA))
        return false;

    // Grow internal buffer if needed
    if (new_text_len + text_len + 1 > obj->TextW.Size)
    {
        if (!is_resizable)
            return false;
        IM_ASSERT(text_len < obj->TextW.Size);
        obj->TextW.resize(text_len + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1);
    }

    ImWchar* text = obj->TextW.Data;
    if (pos != text_len)
        memmove(text + pos + new_text_len, text + pos, (size_t)(text_len - pos) * sizeof(ImWchar));
    memcpy(text + pos, new_text, (size_t)new_text_len * sizeof(ImWchar));

    obj->Edited = true;
    obj->CurLenW += new_text_len;
    obj->CurLenA += new_text_len_utf8;
    obj->TextW[obj->CurLenW] = '\0';

    return true;
}